

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O2

void testBase(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char **func;
  int patch;
  int min;
  int maj;
  char *extra;
  
  func = &extra;
  exr_get_library_version(&maj,&min,&patch);
  if (((maj == 3) && (min == 2)) && (patch == 0)) {
    iVar1 = strcmp(extra,"\"-dev\"");
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Testing OpenEXR library version: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,maj);
      poVar2 = std::operator<<(poVar2,".");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,min);
      poVar2 = std::operator<<(poVar2,".");
      std::ostream::operator<<(poVar2,patch);
      if (*extra != '\0') {
        poVar2 = std::operator<<((ostream *)&std::cout,"-");
        std::operator<<(poVar2,extra);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      exr_get_library_version(0,&min,&patch,&extra);
      exr_get_library_version(&maj,0,&patch,&extra);
      exr_get_library_version(&maj,&min,0,&extra);
      exr_get_library_version(&maj,&min,&patch,0);
      return;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR testing library, wrong library version: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,maj);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,min);
  poVar2 = std::operator<<(poVar2,".");
  std::ostream::operator<<(poVar2,patch);
  if (*extra != '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"-");
    std::operator<<(poVar2,extra);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr," vs compiled in ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
  poVar2 = std::operator<<(poVar2,".");
  std::ostream::operator<<(poVar2,0);
  poVar2 = std::operator<<((ostream *)&std::cerr,"-");
  std::operator<<(poVar2,"\"-dev\"");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  core_test_fail("false",(char *)0x21,0x14d0c6,(char *)func);
  return;
}

Assistant:

void
testBase (const std::string& tempdir)
{
    int         maj, min, patch;
    const char* extra;
    const char* compextra = COMP_EXTRA;

    exr_get_library_version (&maj, &min, &patch, &extra);
    if (maj != COMP_MAJ || min != COMP_MIN || patch != COMP_PATCH ||
        !strcmp (extra, compextra))
    {
        std::cerr << "ERROR testing library, wrong library version: " << maj
                  << "." << min << "." << patch;
        if (extra[0] != '\0') std::cerr << "-" << extra;
        std::cerr << " vs compiled in " << COMP_MAJ << "." << COMP_MIN << "."
                  << COMP_PATCH;
        if (compextra[0] != '\0') std::cerr << "-" << compextra;
        std::cerr << std::endl;
        EXRCORE_TEST (false);
    }
    std::cout << "Testing OpenEXR library version: " << maj << "." << min << "."
              << patch;
    if (extra[0] != '\0') std::cout << "-" << extra;
    std::cout << std::endl;

    exr_get_library_version (NULL, &min, &patch, &extra);
    exr_get_library_version (&maj, NULL, &patch, &extra);
    exr_get_library_version (&maj, &min, NULL, &extra);
    exr_get_library_version (&maj, &min, &patch, NULL);
}